

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int dohistory(void)

{
  nh_menuitem *pnVar1;
  char *pcVar2;
  bool bVar3;
  bool local_139;
  nh_menuitem *_item_;
  char local_128 [4];
  int i;
  char buf [256];
  undefined1 auStack_20 [6];
  boolean showall;
  boolean over;
  menulist menu;
  
  buf[0xff] = (char)program_state.gameover;
  local_139 = buf[0xff] != '\0' || flags.debug != '\0';
  buf[0xfe] = local_139;
  if (histcount < 2) {
    if (buf[0xff] == '\0') {
      pline("History has not recorded anything about you.");
    }
  }
  else {
    init_menulist((menulist *)auStack_20);
    for (_item_._4_4_ = 0; _item_._4_4_ < histcount; _item_._4_4_ = _item_._4_4_ + 1) {
      if ((histevents[(int)_item_._4_4_].hidden == 0) || (buf[0xfe] != '\0')) {
        bVar3 = false;
        if ((histevents[(int)_item_._4_4_].hidden != 0) && (bVar3 = false, buf[0xff] == '\0')) {
          bVar3 = flags.debug != '\0';
        }
        pcVar2 = "";
        if (bVar3) {
          pcVar2 = "# ";
        }
        snprintf(local_128,0x100,"%sOn T:%u you %s",pcVar2,(ulong)histevents[(int)_item_._4_4_].when
                 ,histevents[(int)_item_._4_4_].what);
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _auStack_20 = (nh_menuitem *)realloc(_auStack_20,(long)(int)menu.items * 0x10c);
        }
        pnVar1 = _auStack_20 + menu.items._4_4_;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,local_128);
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
    }
    display_menu(_auStack_20,menu.items._4_4_,"History has recorded:",0,(int *)0x0);
    free(_auStack_20);
  }
  return 0;
}

Assistant:

int dohistory(void)
{
    struct menulist menu;
    boolean over = program_state.gameover;
    boolean showall = over || wizard;
    char buf[BUFSZ];
    int i;
    
    if (histcount < 2) {
	/* you get an automatic entry on turn 1 for being born.
	 * If it's the only one, there is nothing worth reporting */
	if (!over)
	    pline("History has not recorded anything about you.");
	return 0;
    }
    
    init_menulist(&menu);
    for (i = 0; i < histcount; i++) {
	if (histevents[i].hidden && !showall)
	    continue;
	snprintf(buf, BUFSZ, "%sOn T:%u you %s",
		 (histevents[i].hidden && !over && wizard) ? "# " : "",
		 histevents[i].when, histevents[i].what);
	add_menutext(&menu, buf);
    }
    
    display_menu(menu.items, menu.icount, "History has recorded:", PICK_NONE, NULL);
    free(menu.items);
    
    return 0;
}